

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet.c
# Opt level: O1

int uv_inet_ntop(int af,void *src,char *dst,size_t size)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  byte bVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  char *dst_00;
  uint words [8];
  char tmp [46];
  uint local_88 [8];
  char local_68 [46];
  undefined1 auStack_3a [10];
  
  if (af == 10) {
    local_88[4] = 0;
    local_88[5] = 0;
    local_88[6] = 0;
    local_88[7] = 0;
    local_88[0] = 0;
    local_88[1] = 0;
    local_88[2] = 0;
    local_88[3] = 0;
    bVar1 = 0;
    uVar10 = 0;
    do {
      bVar7 = ~bVar1;
      local_88[uVar10 >> 1 & 0x7fffffff] =
           local_88[uVar10 >> 1 & 0x7fffffff] | (uint)*(byte *)((long)src + uVar10) << (bVar7 & 8);
      uVar10 = uVar10 + 1;
      bVar1 = bVar1 + 8;
    } while (uVar10 != 0x10);
    uVar10 = (ulong)(uint)(0 << (bVar7 & 8));
    uVar11 = 0xffffffff;
    iVar8 = 0;
    uVar3 = 0xffffffff;
    iVar2 = 0;
    do {
      if (local_88[uVar10] == 0) {
        iVar8 = iVar8 + 1;
        if (uVar11 == 0xffffffff) {
          iVar8 = 1;
        }
        if (uVar11 == 0xffffffff) {
          uVar11 = (uint)uVar10;
        }
      }
      else {
        uVar4 = uVar3;
        iVar5 = iVar2;
        if ((uVar11 != 0xffffffff) &&
           (uVar4 = uVar11, iVar5 = iVar8, iVar8 <= iVar2 && uVar3 != 0xffffffff)) {
          uVar4 = uVar3;
          iVar5 = iVar2;
        }
        uVar11 = 0xffffffff;
        uVar3 = uVar4;
        iVar2 = iVar5;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != 8);
    if ((uVar11 != 0xffffffff) && (iVar2 < iVar8 || uVar3 == 0xffffffff)) {
      uVar3 = uVar11;
      iVar2 = iVar8;
    }
    uVar10 = 0xffffffff;
    if (1 < iVar2) {
      uVar10 = (ulong)uVar3;
    }
    if (uVar3 == 0xffffffff) {
      uVar10 = 0xffffffff;
    }
    iVar8 = (int)uVar10;
    dst_00 = local_68;
    uVar9 = 0;
    do {
      if (((iVar8 == -1) || ((long)uVar9 < (long)iVar8)) || ((long)(iVar8 + iVar2) <= (long)uVar9))
      {
        if (uVar9 != 0) {
          *dst_00 = ':';
          dst_00 = dst_00 + 1;
        }
        if ((uVar9 == 6 && iVar8 == 0) &&
           (((iVar2 == 6 || ((iVar2 == 7 && (local_88[7] != 1)))) ||
            ((iVar2 == 5 && (local_88[5] == 0xffff)))))) {
          iVar5 = inet_ntop4((uchar *)((long)src + 0xc),dst_00,(size_t)(auStack_3a + -(long)dst_00))
          ;
          if (iVar5 != 0) {
            return iVar5;
          }
          sVar6 = strlen(dst_00);
          dst_00 = dst_00 + sVar6;
          break;
        }
        iVar5 = sprintf(dst_00,"%x",(ulong)local_88[uVar9]);
        dst_00 = dst_00 + iVar5;
      }
      else if (uVar10 == uVar9) {
        *dst_00 = ':';
        dst_00 = dst_00 + 1;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != 8);
    if ((iVar8 != -1) && (iVar8 + iVar2 == 8)) {
      *dst_00 = ':';
      dst_00 = dst_00 + 1;
    }
    *dst_00 = '\0';
    iVar2 = -0x1c;
    if (dst_00 + (1 - (long)local_68) <= size) {
      uv__strscpy(dst,local_68,size);
      iVar2 = 0;
    }
  }
  else {
    iVar2 = -0x61;
    if (af == 2) {
      iVar2 = inet_ntop4((uchar *)src,dst,size);
      return iVar2;
    }
  }
  return iVar2;
}

Assistant:

int uv_inet_ntop(int af, const void* src, char* dst, size_t size) {
  switch (af) {
  case AF_INET:
    return (inet_ntop4(src, dst, size));
  case AF_INET6:
    return (inet_ntop6(src, dst, size));
  default:
    return UV_EAFNOSUPPORT;
  }
  /* NOTREACHED */
}